

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationSurfaceOccurrence,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcStyledItem *this;
  
  this = (IfcStyledItem *)operator_new(0xa8);
  *(undefined ***)&this[1].field_0x8 = &PTR__Object_007e6a70;
  this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x0;
  this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = (_WordT)"IfcAnnotationSurfaceOccurrence";
  Assimp::IFC::Schema_2x3::IfcStyledItem::IfcStyledItem(this,&PTR_construction_vtable_24__0088f988);
  *(undefined ***)this = &PTR__IfcAnnotationSurfaceOccurrence_0088f8c8;
  *(undefined ***)&this[1].field_0x8 = &PTR__IfcAnnotationSurfaceOccurrence_0088f968;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcAnnotationSurfaceOccurrence_0088f8f0;
  *(undefined ***)&this->field_0x70 = &PTR__IfcAnnotationSurfaceOccurrence_0088f918;
  *(undefined ***)&this->field_0x80 = &PTR__IfcAnnotationSurfaceOccurrence_0088f940;
  GenericFill<Assimp::IFC::Schema_2x3::IfcAnnotationSurfaceOccurrence>
            (db,params,(IfcAnnotationSurfaceOccurrence *)this);
  return (Object *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }